

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextGenerator.cpp
# Opt level: O0

void __thiscall TextGenerator::generate(TextGenerator *this,ostream *output,ScName *stmName)

{
  type *this_00;
  bool bVar1;
  ScStateMap *this_01;
  ulong uVar2;
  ostream *poVar3;
  ScNameSet *pSVar4;
  const_reference pvVar5;
  ScTransitionMap *this_02;
  char *pcVar6;
  ScName local_1c0;
  ScName *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *event_1;
  iterator __end3_2;
  iterator __begin3_2;
  ScNameSet *__range3_2;
  ScName *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *event;
  iterator __end4;
  iterator __begin4;
  type *__range4;
  type *local_120;
  type *events;
  type *target;
  _Self local_108;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  ScTransitionMap *__range3_1;
  ScName *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *substate;
  iterator __end3;
  iterator __begin3;
  ScNameSet *__range3;
  ScRegionNum i;
  ScName local_78;
  type *local_58;
  type *state;
  type *name;
  _Self local_40;
  const_iterator __end1;
  const_iterator __begin1;
  ScStateMap *__range1;
  ScStateMap *states;
  ScName *stmName_local;
  ostream *output_local;
  TextGenerator *this_local;
  
  this_01 = ScModel::states_abi_cxx11_((this->super_AbstractGenerator).m_model);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<(output,"Note: discarding a state-machine name\n");
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::begin(this_01);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
       ::end(this_01);
  while (bVar1 = std::operator!=(&__end1,&local_40), bVar1) {
    name = &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>
            ::operator*(&__end1)->first;
    state = (type *)std::get<0ul,std::__cxx11::string_const,ScState>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>
                                *)name);
    local_58 = std::get<1ul,std::__cxx11::string_const,ScState>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>
                           *)name);
    poVar3 = std::operator<<(output,"Name: ");
    hlText(&local_78,this,&state->parent);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_78);
    poVar3 = std::operator<<(output,"Parent: ");
    hlText((ScName *)&i,this,&local_58->parent);
    poVar3 = std::operator<<(poVar3,(string *)&i);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&i);
    for (__range3 = (ScNameSet *)0x0;
        pSVar4 = (ScNameSet *)
                 std::vector<ScRegion,_std::allocator<ScRegion>_>::size(&local_58->regions),
        __range3 < pSVar4; __range3 = (ScNameSet *)&(__range3->_M_t)._M_impl.field_0x1) {
      poVar3 = std::operator<<(output,"Substates (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)__range3);
      poVar3 = std::operator<<(poVar3,") [");
      pvVar5 = std::vector<ScRegion,_std::allocator<ScRegion>_>::operator[]
                         (&local_58->regions,(size_type)__range3);
      poVar3 = std::operator<<(poVar3,(string *)pvVar5);
      std::operator<<(poVar3,"]:\n");
      pvVar5 = std::vector<ScRegion,_std::allocator<ScRegion>_>::operator[]
                         (&local_58->regions,(size_type)__range3);
      __end3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pvVar5->states);
      substate = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&pvVar5->states);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&substate), bVar1) {
        local_d0 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end3);
        poVar3 = std::operator<<(output,"    ");
        hlText((ScName *)&__range3_1,this,local_d0);
        poVar3 = std::operator<<(poVar3,(string *)&__range3_1);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&__range3_1);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
    bVar1 = std::
            map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(&local_58->transitions);
    if (!bVar1) {
      std::operator<<(output,"Transitions:\n");
      this_02 = &local_58->transitions;
      __end3_1 = std::
                 map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::begin(this_02);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(this_02);
      while (bVar1 = std::operator!=(&__end3_1,&local_108), bVar1) {
        target = &std::
                  _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end3_1)->first;
        events = (type *)std::
                         get<0ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                                   ((pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)target);
        local_120 = std::
                    get<1ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                              ((pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)target);
        poVar3 = std::operator<<(output,"==> ");
        hlText((ScName *)&__range4,this,(ScName *)events);
        poVar3 = std::operator<<(poVar3,(string *)&__range4);
        pcVar6 = "\n";
        if (*(int *)&(events->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right != 0) {
          pcVar6 = " (history)\n";
        }
        std::operator<<(poVar3,pcVar6);
        std::__cxx11::string::~string((string *)&__range4);
        this_00 = local_120;
        __end4 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(local_120);
        event = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_00);
        while (bVar1 = std::operator!=(&__end4,(_Self *)&event), bVar1) {
          local_160 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end4);
          poVar3 = std::operator<<(output,"    ** ");
          hlText((ScName *)&__range3_2,this,local_160);
          poVar3 = std::operator<<(poVar3,(string *)&__range3_2);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)&__range3_2);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end4);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end3_1);
      }
    }
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&local_58->deferrals);
    if (!bVar1) {
      std::operator<<(output,"Deferrals:\n");
      pSVar4 = &local_58->deferrals;
      __end3_2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pSVar4);
      event_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pSVar4);
      while (bVar1 = std::operator!=(&__end3_2,(_Self *)&event_1), bVar1) {
        local_1a0 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3_2);
        poVar3 = std::operator<<(output,"    ");
        hlText(&local_1c0,this,local_1a0);
        poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_1c0);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_2);
      }
    }
    std::operator<<(output,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>
    ::operator++(&__end1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void TextGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << "Name: " << hlText(name) << "\n";
        output << "Parent: " << hlText(state.parent) << "\n";
        for (ScRegionNum i = 0; i < state.regions.size(); i++) {
            output << "Substates (" << i << ") [" << state.regions[i].initial << "]:\n";
            for (const auto &substate : state.regions[i].states) {
                output << "    " << hlText(substate) << "\n";
            }
        }
        if (!state.transitions.empty()) {
            output << "Transitions:\n";
            for (const auto &[target, events] : state.transitions) {
                output << "==> " << hlText(target.name)
                       << (target.historyMode != ScHistoryMode::None ? " (history)\n" : "\n");
                for (const auto &event : events) {
                    output << "    ** " << hlText(event) << "\n";
                }
            }
        }
        if (!state.deferrals.empty()) {
            output << "Deferrals:\n";
            for (const auto &event : state.deferrals) {
                output << "    " << hlText(event) << "\n";
            }
        }
        output << "\n";
    }

    output.flush();
}